

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O2

void __thiscall
ParticleArrayTest_Size_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_>::TestBody
          (ParticleArrayTest_Size_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_>
           *this)

{
  int i;
  uint uVar1;
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  AssertHelper local_88;
  int numParticles;
  ParticleArray particles;
  AssertionResult gtest_ar;
  
  particles.particles.
  super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  particles.particles.
  super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  particles.particles.
  super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  numParticles = 0xc;
  for (uVar1 = 0; uVar1 < 0xc; uVar1 = uVar1 + 1) {
    BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>::randomParticle
              ((Particle *)&gtest_ar,
               (BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> *)this);
    std::
    vector<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
    ::push_back(&particles.particles,(Particle *)&gtest_ar);
  }
  local_90.ptr_._0_4_ =
       (undefined4)
       (((long)particles.particles.
               super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)particles.particles.
              super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x38);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"numParticles","particles.size()",&numParticles,(int *)&local_90)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
               ,0x45,message);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::
  _Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
  ::~_Vector_base((_Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
                   *)&particles);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Size)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles;
    int numParticles = 12;
    for (int i = 0; i < numParticles; i++)
        particles.pushBack(this->randomParticle());
    ASSERT_EQ(numParticles, particles.size());
}